

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBoxPrivate::QMessageBoxPrivate(QMessageBoxPrivate *this)

{
  QDialogPrivate *in_RDI;
  
  QDialogPrivate::QDialogPrivate(in_RDI);
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR__QMessageBoxPrivate_00d259f8;
  QList<QAbstractButton_*>::QList((QList<QAbstractButton_*> *)0x7aa88b);
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x50 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x58 = 0;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x60 = 0;
  in_RDI[1].super_QWidgetPrivate.field_0x68 = 0;
  in_RDI[1].super_QWidgetPrivate.field_0x69 = 1;
  *(undefined8 *)&in_RDI[1].super_QWidgetPrivate.field_0x70 = 0;
  in_RDI[1].super_QWidgetPrivate.extra._M_t.
  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  QPointer<QObject>::QPointer((QPointer<QObject> *)0x7aa902);
  QByteArray::QByteArray((QByteArray *)0x7aa913);
  QByteArray::QByteArray((QByteArray *)0x7aa924);
  QMessageDialogOptions::create();
  return;
}

Assistant:

QMessageBoxPrivate() : escapeButton(nullptr), defaultButton(nullptr), checkbox(nullptr), clickedButton(nullptr), detailsButton(nullptr),
#if QT_CONFIG(textedit)
                           detailsText(nullptr),
#endif
                           compatMode(false), autoAddOkButton(true),
                           detectedEscapeButton(nullptr), informativeLabel(nullptr),
                           options(QMessageDialogOptions::create()) { }